

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O0

int Saig_ManSimInfo2Not(int Value)

{
  int local_c;
  int Value_local;
  
  if (Value == 0) {
    local_c = 1;
  }
  else if (Value == 1) {
    local_c = 0;
  }
  else if (Value == 2) {
    local_c = 3;
  }
  else {
    if (Value != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                    ,0x62,"int Saig_ManSimInfo2Not(int)");
    }
    local_c = 2;
  }
  return local_c;
}

Assistant:

static inline int Saig_ManSimInfo2Not( int Value )
{
    if ( Value == SAIG_ZER_NEW )
        return SAIG_ONE_NEW;
    if ( Value == SAIG_ONE_NEW )
        return SAIG_ZER_NEW;
    if ( Value == SAIG_ZER_OLD )
        return SAIG_ONE_OLD;
    if ( Value == SAIG_ONE_OLD )
        return SAIG_ZER_OLD;
    assert( 0 );
    return 0;
}